

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastShiftRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                        Vec_Int_t *vRes)

{
  int iVar1;
  int *pShift_00;
  int local_48;
  int local_44;
  int iRes;
  int i;
  int *pShiftNew;
  int nShiftMax;
  int fSticky_local;
  int nShift_local;
  int *pShift_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Abc_Base2Log(nNum);
  pShift_00 = (int *)malloc((long)nShift << 2);
  memcpy(pShift_00,pShift,(long)nShift << 2);
  pShiftNew._4_4_ = nShift;
  if ((iVar1 < nShift) && (0x1e < nShift)) {
    local_48 = pShift_00[iVar1];
    local_44 = iVar1;
    while (local_44 = local_44 + 1, local_44 < nShift) {
      local_48 = Gia_ManHashOr(pNew,local_48,pShift_00[local_44]);
    }
    pShiftNew._4_4_ = iVar1 + 1;
    pShift_00[iVar1] = local_48;
  }
  Wlc_BlastShiftRightInt(pNew,pNum,nNum,pShift_00,pShiftNew._4_4_,fSticky,vRes);
  if (pShift_00 != (int *)0x0) {
    free(pShift_00);
  }
  return;
}

Assistant:

void Wlc_BlastShiftRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    int * pShiftNew = ABC_ALLOC( int, nShift );
    memcpy( pShiftNew, pShift, sizeof(int)*nShift );
    if ( nShiftMax < nShift && nShift > 30 )
    {
        int i, iRes = pShiftNew[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShiftNew[i] );
        pShiftNew[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftRightInt( pNew, pNum, nNum, pShiftNew, nShiftMax, fSticky, vRes );
    ABC_FREE( pShiftNew );
}